

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::directory_entry::refresh(directory_entry *this)

{
  bool bVar1;
  int code;
  filesystem_error *this_00;
  error_code ec_00;
  string local_40;
  undefined1 auStack_20 [8];
  error_code ec;
  directory_entry *this_local;
  
  ec._M_cat = (error_category *)this;
  std::error_code::error_code((error_code *)auStack_20);
  refresh(this,(error_code *)auStack_20);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_20);
  if (!bVar1) {
    return;
  }
  this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_20);
  detail::systemErrorText<int>(&local_40,code);
  ec_00._0_8_ = (ulong)auStack_20 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this_00,&local_40,&this->_path,ec_00);
  __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void directory_entry::refresh()
{
    std::error_code ec;
    refresh(ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), _path, ec);
    }
}